

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hex_float.h
# Opt level: O2

int_type __thiscall
spvtools::utils::
HexFloat<spvtools::utils::FloatProxy<spvtools::utils::Float16>,_spvtools::utils::HexFloatTraits<spvtools::utils::FloatProxy<spvtools::utils::Float16>_>_>
::getUnbiasedNormalizedExponent
          (HexFloat<spvtools::utils::FloatProxy<spvtools::utils::Float16>,_spvtools::utils::HexFloatTraits<spvtools::utils::FloatProxy<spvtools::utils::Float16>_>_>
           *this)

{
  ushort uVar1;
  short sVar2;
  uint_type significand_bits;
  
  uVar1 = (this->value_).data_;
  _significand_bits = (uint)uVar1;
  if ((uVar1 & 0x7fff) != 0) {
    if ((uVar1 >> 10 & 0x1f) == 0) {
      sVar2 = -0xf;
      for (; (_significand_bits >> 9 & 1) == 0; _significand_bits = _significand_bits * 2) {
        sVar2 = sVar2 + -1;
      }
    }
    else {
      sVar2 = (uVar1 >> 10 & 0x1f) - 0xf;
    }
    return sVar2;
  }
  return 0;
}

Assistant:

uint_type data() const { return data_; }